

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.cpp
# Opt level: O2

void __thiscall base_blob<256U>::SetHexDeprecated(base_blob<256U> *this,string_view str)

{
  uchar *puVar1;
  long lVar2;
  char cVar3;
  uchar uVar4;
  long lVar5;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  long in_FS_OFFSET;
  string_view prefix;
  string_view sVar10;
  char *pcVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    (this->m_data)._M_elems[lVar5] = '\0';
  }
  sVar10._M_str = " \f\n\r\t\v";
  sVar10._M_len = 6;
  sVar10 = util::TrimStringView(str,sVar10);
  prefix._M_str = "0x";
  prefix._M_len = 2;
  sVar10 = util::RemovePrefixView(sVar10,prefix);
  pcVar6 = sVar10._M_str;
  sVar7 = 0;
  while ((sVar9 = sVar10._M_len, sVar10._M_len != sVar7 &&
         (cVar3 = HexDigit(pcVar6[sVar7]), sVar9 = sVar7, cVar3 != -1))) {
    sVar7 = sVar7 + 1;
  }
  uVar8 = 0;
  while ((sVar7 = sVar9, sVar7 != 0 && (uVar8 < 0x20))) {
    uVar4 = HexDigit(pcVar6[sVar7 - 1]);
    (this->m_data)._M_elems[uVar8] = uVar4;
    sVar9 = 0;
    if (sVar7 != 1) {
      cVar3 = HexDigit(pcVar6[sVar7 - 2]);
      puVar1 = (this->m_data)._M_elems + uVar8;
      *puVar1 = *puVar1 | cVar3 << 4;
      uVar8 = uVar8 + 1;
      sVar9 = sVar7 - 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void base_blob<BITS>::SetHexDeprecated(const std::string_view str)
{
    std::fill(m_data.begin(), m_data.end(), 0);

    const auto trimmed = util::RemovePrefixView(util::TrimStringView(str), "0x");

    // Note: if we are passed a greater number of digits than would fit as bytes
    // in m_data, we will be discarding the leftmost ones.
    // str="12bc" in a WIDTH=1 m_data => m_data[] == "\0xbc", not "0x12".
    size_t digits = 0;
    for (const char c : trimmed) {
        if (::HexDigit(c) == -1) break;
        ++digits;
    }
    unsigned char* p1 = m_data.data();
    unsigned char* pend = p1 + WIDTH;
    while (digits > 0 && p1 < pend) {
        *p1 = ::HexDigit(trimmed[--digits]);
        if (digits > 0) {
            *p1 |= ((unsigned char)::HexDigit(trimmed[--digits]) << 4);
            p1++;
        }
    }
}